

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_double_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_fe *rzr)

{
  void *in_RDX;
  secp256k1_gej *in_RSI;
  secp256k1_gej *in_stack_00000078;
  secp256k1_gej *in_stack_00000080;
  
  secp256k1_gej_verify(in_RSI);
  if (in_RSI->infinity == 0) {
    if (in_RDX != (void *)0x0) {
      memcpy(in_RDX,&in_RSI->y,0x30);
      secp256k1_fe_normalize_weak((secp256k1_fe *)0x133992);
    }
    secp256k1_gej_double(in_stack_00000080,in_stack_00000078);
    secp256k1_gej_verify(in_RSI);
  }
  else {
    secp256k1_gej_set_infinity((secp256k1_gej *)0x133954);
    if (in_RDX != (void *)0x0) {
      secp256k1_fe_set_int(&in_RSI->x,(int)((ulong)in_RDX >> 0x20));
    }
  }
  return;
}

Assistant:

static void secp256k1_gej_double_var(secp256k1_gej *r, const secp256k1_gej *a, secp256k1_fe *rzr) {
    SECP256K1_GEJ_VERIFY(a);

    /** For secp256k1, 2Q is infinity if and only if Q is infinity. This is because if 2Q = infinity,
     *  Q must equal -Q, or that Q.y == -(Q.y), or Q.y is 0. For a point on y^2 = x^3 + 7 to have
     *  y=0, x^3 must be -7 mod p. However, -7 has no cube root mod p.
     *
     *  Having said this, if this function receives a point on a sextic twist, e.g. by
     *  a fault attack, it is possible for y to be 0. This happens for y^2 = x^3 + 6,
     *  since -6 does have a cube root mod p. For this point, this function will not set
     *  the infinity flag even though the point doubles to infinity, and the result
     *  point will be gibberish (z = 0 but infinity = 0).
     */
    if (a->infinity) {
        secp256k1_gej_set_infinity(r);
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        return;
    }

    if (rzr != NULL) {
        *rzr = a->y;
        secp256k1_fe_normalize_weak(rzr);
    }

    secp256k1_gej_double(r, a);

    SECP256K1_GEJ_VERIFY(r);
}